

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

int stbir__edge_wrap_full(int n,int max)

{
  int iVar1;
  int iVar2;
  
  iVar2 = n % max;
  iVar1 = max + iVar2;
  if (iVar2 == 0) {
    iVar1 = iVar2;
  }
  if (-1 < n) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

static int stbir__edge_wrap_full( int n, int max )
{
  if (n >= 0)
    return (n % max);
  else
  {
    int m = (-n) % max;

    if (m != 0)
      m = max - m;

    return (m);
  }
}